

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_evaluate_nurbs.cpp
# Opt level: O3

bool ON_EvaluateBezier(int dim,bool is_rat,int order,int cv_stride,double *cv,double t0,double t1,
                      int der_count,double t,int v_stride,double *v)

{
  bool bVar1;
  double *cv_00;
  ulong uVar2;
  uint uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  uint cv_stride_00;
  int iVar7;
  undefined7 in_register_00000031;
  double *pdVar8;
  size_t sz;
  double *pdVar9;
  long lVar10;
  long lVar11;
  double *pdVar12;
  int iVar13;
  int iVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  uchar stack_buffer [2048];
  double *local_860;
  double local_838 [257];
  
  cv_stride_00 = (int)CONCAT71(in_register_00000031,is_rat) + dim;
  uVar3 = cv_stride;
  if (cv_stride < (int)cv_stride_00) {
    uVar3 = cv_stride_00;
  }
  memset(v,0,(long)((der_count + 1) * v_stride) << 3);
  if ((t0 == t1) && (!NAN(t0) && !NAN(t1))) {
    ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_evaluate_nurbs.cpp"
               ,0x21e,"","Invalid domain");
    return false;
  }
  iVar6 = order + -1;
  iVar13 = (der_count - iVar6) * cv_stride_00;
  iVar14 = der_count;
  if (!is_rat) {
    iVar13 = 0;
    iVar14 = iVar6;
  }
  local_860 = (double *)0x0;
  if (der_count < order) {
    iVar13 = 0;
    iVar14 = der_count;
  }
  sz = (long)(int)(iVar13 + cv_stride_00 * order) << 3;
  if (sz < 0x801) {
    cv_00 = local_838;
  }
  else {
    cv_00 = (double *)onmalloc(sz);
    local_860 = cv_00;
  }
  if (iVar13 != 0) {
    memset(cv_00 + (int)(cv_stride_00 * order),0,(long)iVar13 << 3);
  }
  if ((t0 != t) || (NAN(t0) || NAN(t))) {
    if (t <= (t0 + t1) * 0.5) {
      if ((t != t1) || (NAN(t) || NAN(t1))) goto LAB_0045cf71;
    }
    pdVar12 = cv + (int)(uVar3 * order);
    if (order != 0) {
      pdVar8 = cv_00;
      iVar13 = order;
      do {
        pdVar12 = pdVar12 + -(long)(int)uVar3;
        memcpy(pdVar8,pdVar12,(long)(int)cv_stride_00 * 8);
        pdVar8 = pdVar8 + (int)cv_stride_00;
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    dVar17 = t0 - t;
    dVar15 = 1.0 / (t1 - t0);
    dVar16 = (t1 - t) * dVar15;
    dVar15 = (t - t0) * dVar15;
  }
  else {
LAB_0045cf71:
    if (0 < order) {
      pdVar12 = cv_00;
      iVar13 = order;
      do {
        memcpy(pdVar12,cv,(long)(int)cv_stride_00 * 8);
        cv = cv + (int)uVar3;
        pdVar12 = pdVar12 + (int)cv_stride_00;
        iVar13 = iVar13 + -1;
      } while (iVar13 != 0);
    }
    pdVar12 = cv + -(long)(int)(uVar3 * order);
    dVar17 = t1 - t;
    dVar15 = 1.0 / (t1 - t0);
    dVar16 = (t - t0) * dVar15;
    dVar15 = dVar15 * dVar17;
  }
  if (iVar6 != 0 && dVar16 != 0.0) {
    pdVar8 = cv_00 + (int)cv_stride_00;
    pdVar9 = cv_00;
    iVar13 = iVar6;
    do {
      if (cv_stride_00 != 0) {
        lVar10 = 0;
        lVar11 = 0;
        do {
          pdVar9[lVar11] = pdVar9[lVar11] * dVar15 + pdVar8[lVar11] * dVar16;
          lVar11 = lVar11 + 1;
          lVar10 = lVar10 + -8;
        } while ((uint)lVar11 != cv_stride_00);
        pdVar8 = (double *)((long)pdVar8 - lVar10);
        pdVar9 = (double *)((long)pdVar9 - lVar10);
      }
      iVar6 = iVar6 + -1;
    } while ((iVar6 != 0) ||
            (iVar6 = iVar13 + -1, pdVar8 = cv_00 + (int)cv_stride_00, pdVar9 = cv_00, iVar13 = iVar6
            , iVar6 != 0));
  }
  if ((!is_rat) ||
     (((cv_00[dim] != 0.0 || (NAN(cv_00[dim]))) ||
      (bVar1 = ON_RemoveBezierSingAt0(dim,order,cv_stride_00,cv_00), bVar1)))) {
    if (iVar14 != 0) {
      iVar6 = iVar14 + 1;
      if (order <= iVar14) {
        iVar6 = order;
      }
      iVar13 = iVar6 + -1;
      if (iVar13 != 0) {
        dVar15 = (double)order;
        do {
          dVar15 = dVar15 + -1.0;
          uVar3 = cv_stride_00;
          pdVar8 = cv_00 + (int)(iVar6 * cv_stride_00);
          pdVar9 = cv_00 + (int)(iVar6 * cv_stride_00) + -(long)(int)cv_stride_00;
          iVar7 = iVar13;
          do {
            for (; uVar3 != 0; uVar3 = uVar3 - 1) {
              pdVar8[-1] = (pdVar8[-1] - pdVar9[-1]) * (1.0 / dVar17) * dVar15;
              pdVar8 = pdVar8 + -1;
              pdVar9 = pdVar9 + -1;
            }
            iVar7 = iVar7 + -1;
            uVar3 = cv_stride_00;
          } while (iVar7 != 0);
          iVar13 = iVar13 + -1;
        } while (iVar13 != 0);
      }
    }
    if (0 < (int)cv_stride_00 && order == 2) {
      uVar2 = (ulong)cv_stride_00;
      uVar4 = (long)cv_stride;
      if ((long)cv_stride <= (long)uVar2) {
        uVar4 = uVar2;
      }
      uVar5 = 0;
      do {
        dVar15 = pdVar12[uVar5];
        if ((dVar15 == pdVar12[uVar4 + uVar5]) && (!NAN(dVar15) && !NAN(pdVar12[uVar4 + uVar5]))) {
          cv_00[uVar5] = dVar15;
        }
        uVar5 = uVar5 + 1;
      } while (uVar2 != uVar5);
    }
    if (is_rat) {
      ON_EvaluateQuotientRule(dim,iVar14,cv_stride_00,cv_00);
    }
    if (-1 < iVar14) {
      iVar14 = iVar14 + 1;
      do {
        memcpy(v,cv_00,(long)dim << 3);
        cv_00 = cv_00 + (int)cv_stride_00;
        v = v + v_stride;
        iVar14 = iVar14 + -1;
      } while (iVar14 != 0);
    }
    bVar1 = true;
    if (local_860 != (double *)0x0) {
      onfree(local_860);
    }
  }
  else {
    if (local_860 != (double *)0x0) {
      onfree(local_860);
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_EvaluateBezier(
                int dim,              // dimension
                bool is_rat,          // true if NURBS is rational
                int order,            // order
                int cv_stride,        // cv_stride >= (is_rat)?dim+1:dim
                const double* cv,     // cv[order*cv_stride] array
                double t0, double t1, // domain
                int der_count,        // number of derivatives to compute
                double t,             // evaluation parameter
                int v_stride,         // v_stride (>=dimension)
                double* v             // v[(der_count+1)*v_stride] array
                )
/*****************************************************************************
Evaluate a Bezier
 
INPUT:
  dim
    (>= 1) dimension of Bezier's range
  is_rat
    0: bezier is not rational
    1: bezier is rational
  order
    (>= 2) (order = degree+1)
  cv
    array of (dim+is_rat)*order doubles that define the
    Bezier's control vertices.
  t0, t1  (t0 != t1)
    Bezier's domain.   Mathematically, Beziers have domain [0,1].  In practice
    Beziers are frequently evaluated at (t-t0)/(t1-t0) and the chain
    rule is used to evaluate the derivatives.  This function is the most
    efficient place to apply the chain rule.
  t
    Evaluation parameter
  der_count
    (>= 0)  number of derivatives to evaluate
  answer
     answer[i] is nullptr or points to an array of dim doubles.
OUTPUT:
  ON_EvBezier()
    0: successful
   -1: failure - rational function had nonzero numerator and zero
                 denominator
  answer
     bez(t)   = answer[0]
     bez'(t)  = answer[1]
              ...
        (n)
     bez  (t) = answer[n]
COMMENTS:
  Use de Casteljau's algorithm.  Rational functions with removable singularities
  (like x^2/x) are efficiently and correctly handled.
EXAMPLE:
  // ...
REFERENCE:
  AUTHOR page ?
RELATED FUNCTIONS:
  ON_EvaluatedeCasteljau
  ON_EvQuotientRule
  ON_EvNurb
  ON_EvPolynomialPoint
  ON_onvertBezierToPolynomial
  ON_onvertPolynomialToBezier
  ON_onvertNurbToBezier
*****************************************************************************/
{
  unsigned char stack_buffer[4*64*sizeof(double)];
  double delta_t;
  double alpha0;
  double alpha1;
  double *cv0, *cv1;
  int i, j, k; 
  double* CV, *tmp;
  void* free_me = 0;
  const int degree = order-1;
  const int cvdim = (is_rat)?dim+1:dim;

  if ( cv_stride < cvdim )
    cv_stride = cvdim;

  memset( v, 0, v_stride*(der_count+1)*sizeof(*v) );


  if (!(t0!=t1)) 
  {
    // Fix http://mcneel.myjetbrains.com/youtrack/issue/RH-28304
    //  This test for valid domain was being done only in debug builds
    //  and not in release builds.  The #if defined(ON_DEBUG) projection
    //  has been here since 2005 when we switched to svn.
    //  I can't determine when or why it got added because it happened
    //  when we used SourceSafe or earlier version control.
    //  The bug was a crash in release builds, which skipped this test.
    //  I'm enabling the test in all builds and addeing a call to ON_ERROR().
    ON_ERROR("Invalid domain");
    return false;
  }

  i = order*cvdim;
  j = 0;
  if (der_count > degree) {
    if (is_rat)
      j = (der_count-degree)*cvdim;
    else {
      der_count = degree;
    }    
  }

  size_t sizeofCV = (i+j)*sizeof(*CV);

  CV = (double*)( (sizeofCV <= sizeof(stack_buffer)) ? stack_buffer : (free_me=onmalloc(sizeofCV)) );
  if (j) {
    memset( CV+i, 0, j*sizeof(*CV) );
  }
  cv0=CV;
  if (    t0 == t 
       || (t <= 0.5*(t0+t1) && t != t1) 
     ) 
  {
    for ( i = 0; i < order; i++ ) 
    {
      memcpy( cv0, cv, cvdim*sizeof(*cv0) );
      cv0 += cvdim;
      cv += cv_stride;
    }
    cv -= (cv_stride*order);
    delta_t = 1.0/(t1 - t);
    alpha1 = 1.0/(t1-t0);
    alpha0 = (t1-t)*alpha1;
    alpha1 *= t-t0;
  }
  else 
  {
    cv += (cv_stride*order);
    k=order;
    while(k--) 
    {
      cv -= cv_stride; 
      memcpy( cv0, cv, cvdim*sizeof(*cv0) );
      cv0 += cvdim;
    }
    delta_t = 1.0/(t0 - t);
    alpha0 = 1.0/(t1-t0);
    alpha1 = (t1-t)*alpha0;
    alpha0 *= t-t0;
  }

  /* deCasteljau (from the right) */
  if (alpha1 != 0.0) {
    j = order; while (--j) {
      cv0 = CV;
      cv1 = cv0 + cvdim;
      i = j; while (i--) {
        k = cvdim; 
        while (k--) {
          *cv0 = *cv0 * alpha0 + *cv1 * alpha1; 
          cv0++; 
          cv1++;
        }
      }
    }
  }
  
  /* check for removable singularity */
  if (is_rat && CV[dim] == 0.0)
  {
    if ( !ON_RemoveBezierSingAt0(dim,order,cvdim,CV) )
    {
      if ( free_me )
        onfree(free_me);  
      return false;
    }
  }

  /* Lee (from the right) */
  if (der_count) { 
    tmp=CV;
    alpha0 = order;
    j = (der_count>=order)?order:der_count+1;
    CV += cvdim*j; while(--j) {
      alpha0 -= 1.0; cv1 = CV; cv0 = cv1-cvdim;
      i=j; while(i--) {
        alpha1 = alpha0 * delta_t;
        k=cvdim; while(k--) {
          cv0--; 
          cv1--; 
          *cv1 = alpha1*(*cv1 - *cv0);
        }
      }
    }
    CV=tmp;
  }

  if ( 2 == order )
  {
    // 7 January 2004  Dale Lear
    //    Added to fix those cases when, numerically, t*a + (1.0-t)*a != a.
    //    Similar to fix for RR 9683.
    j = cv_stride;
    for ( i = 0; i < cvdim; i++, j++ )
    {
      if ( cv[i] == cv[j] )
      {
        CV[i] = cv[i];
      }
    }
  }

  if (is_rat) {
    ON_EvaluateQuotientRule( dim, der_count, cvdim, CV );
  }

  for (i=0;i<=der_count;i++) {
    memcpy( v, CV, dim*sizeof(*v) );
    v += v_stride;
    CV += cvdim;
  }

  if ( free_me )
    onfree(free_me);  

  return true;
}